

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O0

uint64_t atol10(char *p,size_t char_cnt)

{
  char cVar1;
  bool bVar2;
  undefined4 local_2c;
  char *pcStack_28;
  int digit;
  uint64_t l;
  size_t char_cnt_local;
  char *p_local;
  
  if (char_cnt == 0) {
    p_local = (char *)0x0;
  }
  else {
    pcStack_28 = (char *)0x0;
    cVar1 = *p;
    l = char_cnt;
    char_cnt_local = (size_t)p;
    while( true ) {
      local_2c = cVar1 + -0x30;
      bVar2 = false;
      if ((-1 < local_2c) && (bVar2 = false, local_2c < 10)) {
        bVar2 = l != 0;
        l = l - 1;
      }
      if (!bVar2) break;
      pcStack_28 = (char *)((long)pcStack_28 * 10 + (long)local_2c);
      cVar1 = *(char *)(char_cnt_local + 1);
      char_cnt_local = char_cnt_local + 1;
    }
    p_local = pcStack_28;
  }
  return (uint64_t)p_local;
}

Assistant:

static uint64_t
atol10(const char *p, size_t char_cnt)
{
	uint64_t l;
	int digit;

	if (char_cnt == 0)
		return (0);

	l = 0;
	digit = *p - '0';
	while (digit >= 0 && digit < 10  && char_cnt-- > 0) {
		l = (l * 10) + digit;
		digit = *++p - '0';
	}
	return (l);
}